

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<short,_false,_true>::Subarray
          (TypedArray<short,_false,_true> *this,uint32 begin,uint32 end)

{
  int iVar1;
  code *pcVar2;
  anon_class_40_5_98b124e0_for_newObjectCreationFunction newObjectCreationFunction;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  ScriptContext *scriptContext_00;
  ArrayBufferBase *pAVar6;
  JavascriptFunction *defaultConstructor_00;
  JavascriptFunction *instanceObj;
  ThreadContext *threadContext;
  Var aValue;
  RecyclableObject *pRVar7;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  uint32 newLength;
  uint32 beginByteOffset;
  uint32 srcByteOffset;
  ArrayBufferBase *buffer;
  ScriptContext *scriptContext;
  Var newTypedArray;
  uint32 end_local;
  uint32 begin_local;
  TypedArray<short,_false,_true> *this_local;
  
  if (end < begin) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x53d,"(end >= begin)","end >= begin");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pAVar6 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
  uVar4 = Js::TypedArrayBase::GetByteOffset(&this->super_TypedArrayBase);
  iVar1 = (this->super_TypedArrayBase).BYTES_PER_ELEMENT;
  defaultConstructor_00 = Js::TypedArrayBase::GetDefaultConstructor(this,scriptContext_00);
  instanceObj = (JavascriptFunction *)
                Js::JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)this,defaultConstructor_00,scriptContext_00);
  bVar3 = Js::JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x548,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  threadContext = ScriptContext::GetThreadContext(scriptContext_00);
  newObjectCreationFunction._36_4_ = uStack_5c;
  newObjectCreationFunction.newLength = end - begin;
  newObjectCreationFunction._20_4_ = uStack_6c;
  newObjectCreationFunction.beginByteOffset = uVar4 + begin * iVar1;
  newObjectCreationFunction.buffer = pAVar6;
  newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
  newObjectCreationFunction.scriptContext = scriptContext_00;
  aValue = Js::JavascriptOperators::
           NewObjectCreationHelper_ReentrancySafe<Js::TypedArray<short,false,true>::Subarray(unsigned_int,unsigned_int)::_lambda()_1_>
                     ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor_00,
                      threadContext,newObjectCreationFunction);
  pRVar7 = VarTo<Js::RecyclableObject>(aValue);
  return pRVar7;
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::Subarray(uint32 begin, uint32 end)
    {
        Assert(end >= begin);

        Var newTypedArray;
        ScriptContext* scriptContext = this->GetScriptContext();
        ArrayBufferBase* buffer = this->GetArrayBuffer();
        uint32 srcByteOffset = this->GetByteOffset();
        uint32 beginByteOffset = srcByteOffset + begin * BYTES_PER_ELEMENT;
        uint32 newLength = end - begin;

        JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(this, scriptContext);
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(this, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        newTypedArray = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, buffer, JavascriptNumber::ToVar(beginByteOffset, scriptContext), JavascriptNumber::ToVar(newLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), newLength, scriptContext);
        }));

        return newTypedArray;
    }